

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ctl.c
# Opt level: O0

int arena_i_dss_ctl(tsd_t *tsd,size_t *mib,size_t miblen,void *oldp,size_t *oldlenp,void *newp,
                   size_t newlen)

{
  _Bool _Var1;
  uint uVar2;
  int iVar3;
  undefined8 *in_RCX;
  long in_RSI;
  undefined8 in_RDI;
  ulong *in_R8;
  undefined8 *in_R9;
  size_t copylen;
  arena_t *arena;
  _Bool match;
  int i;
  dss_prec_t dss_prec;
  dss_prec_t dss_prec_old;
  uint arena_ind;
  char *dss;
  int ret;
  size_t local_88;
  arena_t *in_stack_ffffffffffffff88;
  undefined7 in_stack_ffffffffffffff90;
  byte in_stack_ffffffffffffff97;
  undefined4 in_stack_ffffffffffffff98;
  undefined1 init_if_missing;
  dss_prec_t dVar4;
  dss_prec_t dVar5;
  undefined4 uVar6;
  char *local_58;
  int local_4c;
  undefined8 *local_48;
  ulong *local_40;
  undefined8 *local_38;
  long local_28;
  undefined8 local_20;
  undefined8 local_18;
  undefined8 local_10;
  
  local_58 = (char *)0x0;
  uVar6 = 3;
  dVar5 = dss_prec_limit;
  local_48 = in_R9;
  local_40 = in_R8;
  local_38 = in_RCX;
  local_28 = in_RSI;
  local_20 = in_RDI;
  malloc_mutex_lock((tsdn_t *)CONCAT44(3,in_stack_ffffffffffffff98),
                    (malloc_mutex_t *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90))
  ;
  init_if_missing = (undefined1)((uint)in_stack_ffffffffffffff98 >> 0x18);
  if (local_48 != (undefined8 *)0x0) {
    if (copylen != 8) {
      local_4c = 0x16;
      goto LAB_0014ca4b;
    }
    local_58 = (char *)*local_48;
  }
  if (*(ulong *)(local_28 + 8) < 0x100000000) {
    uVar2 = (uint)*(undefined8 *)(local_28 + 8);
    if (local_58 != (char *)0x0) {
      in_stack_ffffffffffffff97 = 0;
      for (dVar4 = dss_prec_disabled; (int)dVar4 < 3; dVar4 = dVar4 + dss_prec_primary) {
        iVar3 = strcmp(dss_prec_names[(int)dVar4],local_58);
        if (iVar3 == 0) {
          in_stack_ffffffffffffff97 = 1;
          dVar5 = dVar4;
          break;
        }
      }
      init_if_missing = (undefined1)(dVar4 >> 0x18);
      if ((in_stack_ffffffffffffff97 & 1) == 0) {
        local_4c = 0x16;
        goto LAB_0014ca4b;
      }
    }
    if ((uVar2 == 0x1000) || (uVar2 == ctl_arenas->narenas)) {
      if ((dVar5 != dss_prec_limit) && (_Var1 = extent_dss_prec_set(dVar5), _Var1)) {
        local_4c = 0xe;
        goto LAB_0014ca4b;
      }
      dVar5 = extent_dss_prec_get();
    }
    else {
      local_10 = local_20;
      in_stack_ffffffffffffff88 =
           arena_get((tsdn_t *)CONCAT44(uVar2,uVar6),dVar5,(_Bool)init_if_missing);
      if ((in_stack_ffffffffffffff88 == (arena_t *)0x0) ||
         ((dVar5 != dss_prec_limit &&
          (_Var1 = arena_dss_prec_set(in_stack_ffffffffffffff88,dVar5), _Var1)))) {
        local_4c = 0xe;
        goto LAB_0014ca4b;
      }
      dVar5 = arena_dss_prec_get(in_stack_ffffffffffffff88);
    }
    local_58 = dss_prec_names[dVar5];
    if ((local_38 != (undefined8 *)0x0) && (local_40 != (ulong *)0x0)) {
      if (*local_40 != 8) {
        if (*local_40 < 8) {
          local_88 = *local_40;
        }
        else {
          local_88 = 8;
        }
        memcpy(local_38,&local_58,local_88);
        local_4c = 0x16;
        goto LAB_0014ca4b;
      }
      *local_38 = local_58;
    }
    local_4c = 0;
  }
  else {
    local_4c = 0xe;
  }
LAB_0014ca4b:
  local_18 = local_20;
  malloc_mutex_unlock((tsdn_t *)CONCAT17(in_stack_ffffffffffffff97,in_stack_ffffffffffffff90),
                      (malloc_mutex_t *)in_stack_ffffffffffffff88);
  return local_4c;
}

Assistant:

static int
arena_i_dss_ctl(tsd_t *tsd, const size_t *mib, size_t miblen, void *oldp,
    size_t *oldlenp, void *newp, size_t newlen) {
	int ret;
	const char *dss = NULL;
	unsigned arena_ind;
	dss_prec_t dss_prec_old = dss_prec_limit;
	dss_prec_t dss_prec = dss_prec_limit;

	malloc_mutex_lock(tsd_tsdn(tsd), &ctl_mtx);
	WRITE(dss, const char *);
	MIB_UNSIGNED(arena_ind, 1);
	if (dss != NULL) {
		int i;
		bool match = false;

		for (i = 0; i < dss_prec_limit; i++) {
			if (strcmp(dss_prec_names[i], dss) == 0) {
				dss_prec = i;
				match = true;
				break;
			}
		}

		if (!match) {
			ret = EINVAL;
			goto label_return;
		}
	}

	/*
	 * Access via index narenas is deprecated, and scheduled for removal in
	 * 6.0.0.
	 */
	if (arena_ind == MALLCTL_ARENAS_ALL || arena_ind ==
	    ctl_arenas->narenas) {
		if (dss_prec != dss_prec_limit &&
		    extent_dss_prec_set(dss_prec)) {
			ret = EFAULT;
			goto label_return;
		}
		dss_prec_old = extent_dss_prec_get();
	} else {
		arena_t *arena = arena_get(tsd_tsdn(tsd), arena_ind, false);
		if (arena == NULL || (dss_prec != dss_prec_limit &&
		    arena_dss_prec_set(arena, dss_prec))) {
			ret = EFAULT;
			goto label_return;
		}
		dss_prec_old = arena_dss_prec_get(arena);
	}

	dss = dss_prec_names[dss_prec_old];
	READ(dss, const char *);

	ret = 0;
label_return:
	malloc_mutex_unlock(tsd_tsdn(tsd), &ctl_mtx);
	return ret;
}